

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O0

void __thiscall
tf::
Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_deferred_pipelines.cpp:531:38)>_>
::_on_pipe(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_deferred_pipelines_cpp:531:38)>_>
           *this,Pipeflow *pf,Runtime *rt)

{
  anon_class_16_2_f9f079a5 func;
  Pipeflow *in_RDX;
  Runtime *in_RSI;
  
  func.rt = in_RSI;
  func.pf = in_RDX;
  visit_tuple<tf::Pipeline<tf::Pipe<pipeline_1P_S_DeferNextToken(unsigned_long,unsigned_int,tf::PipeType)::__0>>::_on_pipe(tf::Pipeflow&,tf::Runtime&)::_lambda(auto:1&&)_1_,std::tuple<tf::Pipe<pipeline_1P_S_DeferNextToken(unsigned_long,unsigned_int,tf::PipeType)::__0>>,0ul>
            (func,(tuple<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_deferred_pipelines_cpp:531:38)>_>
                   *)in_RDX,(size_t)in_RSI);
  return;
}

Assistant:

void Pipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime& rt) {
  visit_tuple([&](auto&& pipe){
    using callable_t = typename std::decay_t<decltype(pipe)>::callable_t;
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      pipe._callable(pf);
    }
    else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
      pipe._callable(pf, rt);
    }
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}